

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O0

vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *
chaiscript::dispatch::detail::
build_param_type_list<std::shared_ptr<signed_char>,chaiscript::Boxed_Number_const&>
          (_func_shared_ptr<signed_char>_Boxed_Number_ptr *param_1)

{
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_RDI;
  allocator_type *in_stack_ffffffffffffffa8;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> *in_stack_ffffffffffffffb0;
  initializer_list<chaiscript::Type_Info> in_stack_ffffffffffffffb8;
  
  user_type<std::shared_ptr<signed_char>>();
  user_type<chaiscript::Boxed_Number_const&>();
  std::allocator<chaiscript::Type_Info>::allocator((allocator<chaiscript::Type_Info> *)0x3a8aeb);
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffa8);
  std::allocator<chaiscript::Type_Info>::~allocator((allocator<chaiscript::Type_Info> *)0x3a8b10);
  return in_RDI;
}

Assistant:

std::vector<Type_Info> build_param_type_list(Ret (*)(Params...))
        {
          /// \note somehow this is responsible for a large part of the code generation
          return { user_type<Ret>(), user_type<Params>()... };
        }